

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O2

size_t docio_batch_read_docs
                 (docio_handle *handle,uint64_t *offset_array,docio_object *doc_array,
                 size_t array_size,size_t data_size_threshold,size_t batch_size_threshold,
                 async_io_handle *aio_handle,bool keymeta_only)

{
  docio_object *doc;
  docio_object *pdVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  void **ppvVar10;
  size_t sVar11;
  bool bVar12;
  
  uVar2 = handle->file->blocksize;
  if (batch_size_threshold <= array_size) {
    array_size = batch_size_threshold;
  }
  uVar8 = 0;
  iVar9 = 0;
  sVar11 = 0;
  uVar7 = 0;
  while( true ) {
    if (array_size <= uVar7) {
      return sVar11;
    }
    if (data_size_threshold <= uVar8) break;
    doc = doc_array + sVar11;
    doc_array[sVar11].field_3.seqnum = 0;
    (&doc_array[sVar11].field_3)[1].seqnum = 0;
    doc_array[sVar11].body = (void *)0x0;
    *(undefined8 *)&doc_array[sVar11].timestamp = 0;
    *(void **)(&doc_array[sVar11].timestamp + 2) = (void *)0x0;
    pdVar1 = doc_array + sVar11;
    (pdVar1->length).keylen = 0;
    (pdVar1->length).metalen = 0;
    (pdVar1->length).bodylen = 0;
    (pdVar1->length).bodylen_ondisk = 0;
    (pdVar1->length).flag = '\0';
    (pdVar1->length).checksum = '\0';
    (pdVar1->length).reserved = 0;
    if (keymeta_only) {
      lVar5 = docio_read_doc_key_meta
                        (handle,offset_array[uVar7],doc,aio_handle == (async_io_handle *)0x0);
    }
    else {
      lVar5 = docio_read_doc(handle,offset_array[uVar7],doc,aio_handle == (async_io_handle *)0x0);
    }
    if (lVar5 == 0) {
      if (aio_handle == (async_io_handle *)0x0) {
        sVar11 = sVar11 + 1;
      }
      else {
        (*handle->file->ops->aio_prep_read)
                  (aio_handle,(long)iVar9,(size_t)uVar2,offset_array[uVar7]);
        iVar9 = iVar9 + 1;
        if ((iVar9 == (int)aio_handle->queue_depth) && (bVar12 = iVar9 != 0, iVar9 = 0, bVar12)) {
          ppvVar10 = &doc_array->key;
          while (bVar12 = batch_size_threshold != 0, batch_size_threshold = batch_size_threshold - 1
                , bVar12) {
            free(*ppvVar10);
            free(ppvVar10[2]);
            free(ppvVar10[3]);
            *ppvVar10 = (void *)0x0;
            ppvVar10[2] = (void *)0x0;
            ppvVar10[3] = (void *)0x0;
            ppvVar10 = ppvVar10 + 7;
          }
          return 0xffffffffffffffff;
        }
      }
    }
    else {
      uVar3._0_2_ = (doc->length).keylen;
      uVar3._2_2_ = (doc->length).metalen;
      uVar4._0_4_ = (doc->length).bodylen_ondisk;
      uVar4._4_1_ = (doc->length).flag;
      uVar4._5_1_ = (doc->length).checksum;
      uVar4._6_2_ = (doc->length).reserved;
      uVar6 = uVar4 & 0xffffffff;
      if (!keymeta_only) {
        uVar6 = 0;
      }
      uVar8 = ((uVar8 + ((uVar3 & 0xffff) + (uVar3 >> 0x10) + (undefined4)uVar4)) - uVar6) + 0x20;
      sVar11 = sVar11 + 1;
    }
    uVar7 = uVar7 + 1;
  }
  return sVar11;
}

Assistant:

size_t docio_batch_read_docs(struct docio_handle *handle,
                             uint64_t *offset_array,
                             struct docio_object *doc_array,
                             size_t array_size,
                             size_t data_size_threshold,
                             size_t batch_size_threshold,
                             struct async_io_handle *aio_handle,
                             bool keymeta_only)
{
    size_t i = 0;
    size_t sum_doc_size = 0;
    size_t doc_idx = 0;
    size_t block_size = handle->file->blocksize;
    uint64_t _offset = 0;
    int aio_size = 0;
    bool read_fail = false;
    bool read_on_cache_miss = true;

    if (aio_handle) {
        // If async I/O is supported, we will then read non-resident docs from disk
        // by using async I/O operations.
        read_on_cache_miss = false;
    }

    for (i = 0; i < array_size && i < batch_size_threshold &&
           sum_doc_size < data_size_threshold; ++i) {
        memset(&doc_array[doc_idx], 0x0, sizeof(struct docio_object));
        if (keymeta_only) {
            _offset = docio_read_doc_key_meta(handle, offset_array[i], &doc_array[doc_idx],
                                              read_on_cache_miss);
        } else {
            _offset = docio_read_doc(handle, offset_array[i], &doc_array[doc_idx],
                                     read_on_cache_miss);
        }
        if (_offset <= 0) {
            if (aio_handle) {
                // The page is not resident in the cache. Prepare and perform Async I/O
                handle->file->ops->aio_prep_read(aio_handle, aio_size,
                                                 block_size, offset_array[i]);
                if (++aio_size == (int) aio_handle->queue_depth) {
                    int num_sub = _submit_async_io_requests(handle, doc_array, doc_idx,
                                                            aio_handle, aio_size,
                                                            &sum_doc_size,
                                                            keymeta_only);
                    if (num_sub < 0 || num_sub != aio_size) {
                        read_fail = true;
                        break;
                    }
                    aio_size = 0;
                    doc_idx += num_sub;
                }
            } else {
                ++doc_idx; // Error in reading a doc.
            }
        } else {
            sum_doc_size += _fdb_get_docsize(doc_array[doc_idx].length);
            if (keymeta_only) {
                sum_doc_size -= doc_array[doc_idx].length.bodylen_ondisk;
            }
            ++doc_idx;
        }
    }

    if (aio_size && !read_fail) {
        int num_sub = _submit_async_io_requests(handle, doc_array, doc_idx,
                                                aio_handle, aio_size,
                                                &sum_doc_size, keymeta_only);
        if (num_sub < 0) {
            read_fail = true;
        } else {
            doc_idx += num_sub;
        }
    }

    if (read_fail) {
        for (i = 0; i < batch_size_threshold; ++i) {
            free(doc_array[i].key);
            free(doc_array[i].meta);
            free(doc_array[i].body);
            doc_array[i].key = doc_array[i].meta = doc_array[i].body = NULL;
        }
        return (size_t) -1;
    }

    return doc_idx;
}